

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

char16 * Js::JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  char16 *pcVar7;
  uint local_9c;
  uint32 i_1;
  charcount_t len;
  charcount_t remainingSpace;
  char16 *ptr;
  TrackAllocData local_78;
  char16_t *local_50;
  char16 *key;
  uint32 keyLength;
  uint32 i;
  JavascriptString *str;
  uint32 totalStringLength;
  uint32 arrayLength;
  ES5Array *rawArray;
  Var var;
  ScriptContext *scriptContext;
  ES5Array *callsiteObj;
  Var callsite_local;
  
  callsiteObj = (ES5Array *)callsite;
  scriptContext = (ScriptContext *)VarTo<Js::ES5Array>(callsite);
  var = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
  rawArray = (ES5Array *)
             Js::JavascriptOperators::OP_GetProperty(scriptContext,0x12a,(ScriptContext *)var);
  _totalStringLength = &VarTo<Js::ES5Array>(rawArray)->super_JavascriptArray;
  str._4_4_ = ArrayObject::GetLength(&_totalStringLength->super_ArrayObject);
  str._0_4_ = 0;
  if (str._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x16c7,"(arrayLength != 0)","arrayLength != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  for (key._4_4_ = 0; key._4_4_ < str._4_4_; key._4_4_ = key._4_4_ + 1) {
    Js::JavascriptArray::DirectGetItemAt<void*>(_totalStringLength,key._4_4_,&rawArray);
    _keyLength = VarTo<Js::JavascriptString>(rawArray);
    cVar4 = JavascriptString::GetLength(_keyLength);
    str._0_4_ = cVar4 + (int)str;
  }
  key._0_4_ = (int)str + -2 + str._4_4_ * 3;
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)var);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&char16_t::typeinfo,0,(ulong)(uint)key,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x16d2);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_78);
  _len = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                   ((Memory *)pRVar6,(Recycler *)Memory::Recycler::Alloc,0,(ulong)(uint)key);
  uVar2 = (uint)key;
  local_50 = _len;
  Js::JavascriptArray::DirectGetItemAt<void*>(_totalStringLength,0,&rawArray);
  _keyLength = VarTo<Js::JavascriptString>(rawArray);
  cVar4 = JavascriptString::GetLength(_keyLength);
  pcVar7 = JavascriptString::GetString(_keyLength);
  js_wmemcpy_s(_len,(ulong)uVar2,pcVar7,(ulong)cVar4);
  _len = _len + cVar4;
  i_1 = uVar2 - cVar4;
  for (local_9c = 1; local_9c < str._4_4_; local_9c = local_9c + 1) {
    js_wmemcpy_s(_len,(ulong)i_1,L"${}",3);
    Js::JavascriptArray::DirectGetItemAt<void*>(_totalStringLength,local_9c,&rawArray);
    _keyLength = VarTo<Js::JavascriptString>(rawArray);
    cVar4 = JavascriptString::GetLength(_keyLength);
    pcVar7 = JavascriptString::GetString(_keyLength);
    js_wmemcpy_s(_len + 3,(ulong)(i_1 - 3),pcVar7,(ulong)cVar4);
    _len = _len + 3 + cVar4;
    i_1 = (i_1 - 3) - cVar4;
  }
  local_50[(uint)key - 1] = L'\0';
  return local_50;
}

Assistant:

const char16* JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)
    {
        // Calculate the key for the string template callsite object.
        // Key is combination of the raw string literals delimited by '${}' since string template literals cannot include that symbol.
        // `str1${expr1}str2${expr2}str3` => "str1${}str2${}str3"

        ES5Array* callsiteObj = VarTo<ES5Array>(callsite);
        ScriptContext* scriptContext = callsiteObj->GetScriptContext();

        Var var = JavascriptOperators::OP_GetProperty(callsiteObj, Js::PropertyIds::raw, scriptContext);
        ES5Array* rawArray = VarTo<ES5Array>(var);
        uint32 arrayLength = rawArray->GetLength();
        uint32 totalStringLength = 0;
        JavascriptString* str;

        Assert(arrayLength != 0);

        // Count the size in characters of the raw strings
        for (uint32 i = 0; i < arrayLength; i++)
        {
            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);
            totalStringLength += str->GetLength();
        }

        uint32 keyLength = totalStringLength + (arrayLength - 1) * 3 + 1;
        char16* key = RecyclerNewArray(scriptContext->GetRecycler(), char16, keyLength);
        char16* ptr = key;
        charcount_t remainingSpace = keyLength;

        // Get first item before loop - there always must be at least one item
        rawArray->DirectGetItemAt(0, &var);
        str = VarTo<JavascriptString>(var);

        charcount_t len = str->GetLength();
        js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
        ptr += len;
        remainingSpace -= len;

        // Append a delimiter and the rest of the items
        for (uint32 i = 1; i < arrayLength; i++)
        {
            len = 3; // strlen(_u("${}"));
            js_wmemcpy_s(ptr, remainingSpace, _u("${}"), len);
            ptr += len;
            remainingSpace -= len;

            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);

            len = str->GetLength();
            js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
            ptr += len;
            remainingSpace -= len;
        }

        // Ensure string is terminated
        key[keyLength - 1] = _u('\0');

        return key;
    }